

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O3

kvtree * kvtree_get_kv(kvtree *hash,char *key,char *val)

{
  kvtree_elem *pkVar1;
  
  if (hash == (kvtree *)0x0) {
    return (kvtree *)0x0;
  }
  pkVar1 = kvtree_elem_get(hash,key);
  if (((pkVar1 != (kvtree_elem *)0x0) && (pkVar1->hash != (kvtree *)0x0)) &&
     (pkVar1 = kvtree_elem_get(pkVar1->hash,val), pkVar1 != (kvtree_elem *)0x0)) {
    return pkVar1->hash;
  }
  return (kvtree *)0x0;
}

Assistant:

kvtree* kvtree_get_kv(const kvtree* hash, const char* key, const char* val)
{
  if (hash == NULL) {
    return NULL;
  }

  kvtree* k = kvtree_get(hash, key);
  if (k == NULL) {
    return NULL;
  }

  kvtree* v = kvtree_get(k, val);
  if (v == NULL) {
    return NULL;
  }

  return v;
}